

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_tcp_storage.h
# Opt level: O0

void __thiscall cppcms::sessions::tcp_storage::~tcp_storage(tcp_storage *this)

{
  tcp_storage *in_RDI;
  
  ~tcp_storage(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

class CPPCMS_API tcp_storage : public session_storage {
public:
	tcp_storage(std::vector<std::string> const &ips,std::vector<int> const &ports) :
		ips_(ips),
		ports_(ports)
	{
	}
	virtual void save(std::string const &sid,time_t timeout,std::string const &in);
	virtual bool load(std::string const &sid,time_t &timeout,std::string &out);
	virtual void remove(std::string const &sid);
	virtual bool is_blocking();
	cppcms::impl::tcp_connector &tcp();
private:
	booster::thread_specific_ptr<cppcms::impl::tcp_connector> tcp_;
	std::vector<std::string> ips_;
	std::vector<int> ports_;
}